

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mutex_stats_read_global
               (char *name,emitter_col_t *col_name,emitter_col_t *col_uint64_t,
               emitter_col_t *col_uint32_t,uint64_t uptime)

{
  int iVar1;
  uint64_t uVar2;
  char *name_00;
  size_t *oldlenp;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  uint64_t in_R8;
  size_t sz_6;
  size_t sz_5;
  emitter_col_t *base_4;
  size_t sz_4;
  emitter_col_t *base_3;
  size_t sz_3;
  emitter_col_t *base_2;
  size_t sz_2;
  emitter_col_t *base_1;
  size_t sz_1;
  emitter_col_t *base;
  size_t sz;
  emitter_col_t *dst;
  char cmd [128];
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  void *in_stack_fffffffffffffef8;
  void *newp;
  size_t *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  void *oldp;
  char *in_stack_ffffffffffffff10;
  undefined1 local_a8 [88];
  
  *(undefined8 *)(in_RSI + 0x10) = in_RDI;
  *(undefined4 *)(in_RDX + 8) = 4;
  gen_mutex_ctl_str((char *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                    in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(char *)0x25c7e1);
  iVar1 = je_mallctl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",local_a8);
    abort();
  }
  *(undefined4 *)(in_RDX + 0x30) = 4;
  uVar2 = rate_per_second(*(uint64_t *)(in_RDX + 0x10),in_R8);
  *(uint64_t *)(in_RDX + 0x38) = uVar2;
  *(undefined4 *)(in_RDX + 0x58) = 4;
  gen_mutex_ctl_str((char *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                    in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(char *)0x25c8b9);
  iVar1 = je_mallctl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",local_a8);
    abort();
  }
  *(undefined4 *)(in_RDX + 0x80) = 4;
  uVar2 = rate_per_second(*(uint64_t *)(in_RDX + 0x60),in_R8);
  *(uint64_t *)(in_RDX + 0x88) = uVar2;
  *(undefined4 *)(in_RDX + 0xa8) = 4;
  gen_mutex_ctl_str((char *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                    in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(char *)0x25c997);
  iVar1 = je_mallctl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",local_a8);
    abort();
  }
  *(undefined4 *)(in_RDX + 0xd0) = 4;
  uVar2 = rate_per_second(*(uint64_t *)(in_RDX + 0xb0),in_R8);
  *(uint64_t *)(in_RDX + 0xd8) = uVar2;
  *(undefined4 *)(in_RDX + 0xf8) = 4;
  gen_mutex_ctl_str((char *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                    in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(char *)0x25ca79);
  iVar1 = je_mallctl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",local_a8);
    abort();
  }
  *(undefined4 *)(in_RDX + 0x120) = 4;
  name_00 = (char *)(in_RDX + 0xf0);
  uVar2 = rate_per_second(*(uint64_t *)(in_RDX + 0x100),in_R8);
  *(uint64_t *)(in_RDX + 0x128) = uVar2;
  *(undefined4 *)(in_RDX + 0x148) = 4;
  gen_mutex_ctl_str((char *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                    in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(char *)0x25cb5b);
  oldp = (void *)0x8;
  iVar1 = je_mallctl(name_00,(void *)0x8,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (size_t)in_stack_fffffffffffffef0);
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",local_a8);
    abort();
  }
  *(undefined4 *)(in_RDX + 0x170) = 4;
  oldlenp = (size_t *)(in_RDX + 0x140);
  uVar2 = rate_per_second(*(uint64_t *)(in_RDX + 0x150),in_R8);
  *(uint64_t *)(in_RDX + 0x178) = uVar2;
  *(undefined4 *)(in_RDX + 0x198) = 4;
  gen_mutex_ctl_str((char *)oldlenp,(size_t)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                    in_stack_fffffffffffffee8,(char *)0x25cc3d);
  newp = (void *)0x8;
  iVar1 = je_mallctl(name_00,oldp,oldlenp,(void *)0x8,(size_t)in_stack_fffffffffffffef0);
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",local_a8);
    abort();
  }
  *(undefined4 *)(in_RCX + 8) = 3;
  gen_mutex_ctl_str((char *)oldlenp,(size_t)newp,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8
                    ,(char *)0x25ccc5);
  iVar1 = je_mallctl(name_00,oldp,oldlenp,newp,4);
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",local_a8);
    abort();
  }
  return;
}

Assistant:

static void
mutex_stats_read_global(const char *name, emitter_col_t *col_name,
    emitter_col_t col_uint64_t[mutex_prof_num_uint64_t_counters],
    emitter_col_t col_uint32_t[mutex_prof_num_uint32_t_counters],
    uint64_t uptime) {
	char cmd[MUTEX_CTL_STR_MAX_LENGTH];

	col_name->str_val = name;

	emitter_col_t *dst;
#define EMITTER_TYPE_uint32_t emitter_type_uint32
#define EMITTER_TYPE_uint64_t emitter_type_uint64
#define OP(counter, counter_type, human, derived, base_counter)	\
	dst = &col_##counter_type[mutex_counter_##counter];		\
	dst->type = EMITTER_TYPE_##counter_type;			\
	if (!derived) {							\
		gen_mutex_ctl_str(cmd, MUTEX_CTL_STR_MAX_LENGTH,	\
		    "mutexes", name, #counter);				\
		CTL_GET(cmd, (counter_type *)&dst->bool_val, counter_type);	\
	} else { \
	    emitter_col_t *base = &col_##counter_type[mutex_counter_##base_counter];	\
	    dst->counter_type##_val = rate_per_second(base->counter_type##_val, uptime); \
	}
	MUTEX_PROF_COUNTERS
#undef OP
#undef EMITTER_TYPE_uint32_t
#undef EMITTER_TYPE_uint64_t
}